

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O3

void __thiscall
solitaire::graphics::
SDLGraphicsSystemAfterWindowCreationFailedTests_throwOnRenderTextureIfWindowNotCreated_Test::
TestBody(SDLGraphicsSystemAfterWindowCreationFailedTests_throwOnRenderTextureIfWindowNotCreated_Test
         *this)

{
  bool bVar1;
  AssertHelper AStack_68;
  long *local_60;
  char *local_58;
  long local_50 [2];
  Message local_40 [4];
  TextureId local_1c;
  
  local_50[0] = 0;
  local_50[1] = 0;
  local_58 = (char *)0x0;
  local_60 = local_50;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_1c.t = (anonymous_namespace)::textureId0;
    SDLGraphicsSystem::renderTexture
              (&(this->super_SDLGraphicsSystemAfterWindowCreationFailedTests).
                super_SDLGraphicsSystemTests.system,&local_1c,
               (Position *)&(anonymous_namespace)::texturePosition,
               (Area *)(anonymous_namespace)::textureArea);
  }
  std::__cxx11::string::_M_replace((ulong)&local_60,0,local_58,0x28b4ac);
  testing::Message::Message(local_40);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_68,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
             ,199,(char *)local_60);
  testing::internal::AssertHelper::operator=(&AStack_68,local_40);
  testing::internal::AssertHelper::~AssertHelper(&AStack_68);
  if (local_40[0].ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_40[0].ss_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  return;
}

Assistant:

TEST_F(SDLGraphicsSystemAfterWindowCreationFailedTests,
       throwOnRenderTextureIfWindowNotCreated)
{
    EXPECT_THROW(
        system.renderTexture(textureId0, texturePosition, textureArea),
        std::runtime_error
    );
}